

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadSegs<mapseg4_t>(MapData *map)

{
  ushort uVar1;
  int iVar2;
  FileReader *pFVar3;
  double *pdVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  vertex_t *pvVar7;
  vertex_t *pvVar8;
  seg_t *psVar9;
  void *__s;
  size_t __n;
  void *buffer;
  undefined4 *puVar10;
  vertex_t **ppvVar11;
  long lVar12;
  ulong uVar13;
  line_t *plVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  short *psVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  TVector2<double> TVar25;
  DVector2 delta;
  DAngle seg_angle;
  DAngle ptp_angle;
  
  uVar20 = (ulong)numvertexes;
  __s = operator_new__(uVar20);
  pFVar3 = map->MapLumps[5].Reader;
  if (pFVar3 == (FileReader *)0x0) {
    uVar15 = 0;
  }
  else {
    uVar15 = (uint)pFVar3->Length;
  }
  uVar13 = 0;
  memset(__s,0,uVar20);
  numsegs = (int)uVar15 >> 4;
  if (uVar15 < 0x10) {
    Printf("This map has no segs.\n");
    if (subsectors != (subsector_t *)0x0) {
      operator_delete__(subsectors);
    }
    if (nodes != (node_t *)0x0) {
      operator_delete__(nodes);
    }
    operator_delete__(__s);
    ForceNodeBuild = true;
  }
  else {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)numsegs;
    __n = SUB168(auVar6 * ZEXT816(0x48),0);
    uVar20 = 0xffffffffffffffff;
    if (SUB168(auVar6 * ZEXT816(0x48),8) == 0) {
      uVar20 = __n;
    }
    segs = (seg_t *)operator_new__(uVar20);
    memset(segs,0,__n);
    buffer = operator_new__((long)(int)uVar15);
    MapData::Read(map,5,buffer,-1);
    uVar20 = (ulong)(uint)numsubsectors;
    if (numsubsectors < 1) {
      uVar20 = uVar13;
    }
    for (; pvVar7 = vertexes, uVar20 * 0x60 - uVar13 != 0; uVar13 = uVar13 + 0x60) {
      *(seg_t **)((long)subsectors->portalcoverage + (uVar13 - 0x28)) =
           segs + *(long *)((long)subsectors->portalcoverage + (uVar13 - 0x28));
    }
    iVar17 = 0;
    if (0 < numlines) {
      iVar17 = numlines;
    }
    ppvVar11 = &lines->v2;
    while (bVar22 = iVar17 != 0, iVar17 = iVar17 + -1, bVar22) {
      *(undefined1 *)((long)__s + ((long)*ppvVar11 - (long)pvVar7) / 0x38) = 1;
      *(undefined1 *)((long)__s + ((long)((line_t *)(ppvVar11 + -1))->v1 - (long)pvVar7) / 0x38) = 1
      ;
      ppvVar11 = ppvVar11 + 0x13;
    }
    psVar19 = (short *)((long)buffer + 0xc);
    lVar21 = 0;
    for (lVar12 = 0; psVar9 = segs, pvVar7 = vertexes, lVar12 < numsegs; lVar12 = lVar12 + 1) {
      iVar17 = *(int *)(psVar19 + -6);
      lVar16 = (long)iVar17;
      iVar2 = *(int *)(psVar19 + -4);
      if ((numvertexes <= iVar17) || (numvertexes <= iVar2)) {
        puVar10 = (undefined4 *)__cxa_allocate_exception(0xc);
        if (iVar2 < iVar17) {
          iVar2 = iVar17;
        }
        *puVar10 = 0;
        puVar10[1] = (int)lVar12;
        puVar10[2] = iVar2;
        __cxa_throw(puVar10,&badseg::typeinfo,0);
      }
      lVar18 = (long)iVar2;
      *(vertex_t **)((long)&segs->v1 + lVar21) = vertexes + lVar16;
      pvVar8 = vertexes;
      *(vertex_t **)((long)&psVar9->v2 + lVar21) = vertexes + lVar18;
      uVar1 = psVar19[-2];
      delta.X = pvVar8[lVar18].p.X - pvVar7[lVar16].p.X;
      delta.Y = pvVar8[lVar18].p.Y - pvVar7[lVar16].p.Y;
      TVector2<double>::Angle((TVector2<double> *)&ptp_angle);
      dVar24 = (ptp_angle.Degrees - (double)((ulong)uVar1 << 0x10) * 8.381903171539307e-08) *
               11930464.711111112 + 6755399441055744.0;
      dVar23 = ABS((double)SUB84(dVar24,0) * 8.381903171539307e-08);
      TVar25.Y = dVar24;
      TVar25.X = dVar23;
      if (1.0 <= dVar23) {
        pdVar4 = *(double **)((long)&psVar9->v1 + lVar21);
        pdVar5 = *(double **)((long)&psVar9->v2 + lVar21);
        delta.X = *pdVar5 - *pdVar4;
        delta.Y = pdVar5[1] - pdVar4[1];
        dVar23 = TVector2<double>::Length(&delta);
        TVar25 = TAngle<double>::ToVector((TAngle<double> *)&delta,dVar23);
        if ((iVar17 < iVar2) && (*(char *)((long)__s + lVar18) == '\0')) {
          pdVar4 = *(double **)((long)&psVar9->v1 + lVar21);
          pdVar5 = *(double **)((long)&psVar9->v2 + lVar21);
          dVar23 = pdVar4[1];
          dVar24 = *pdVar4 + delta.X;
          *pdVar5 = dVar24;
          pdVar5[1] = dVar23 + delta.Y;
        }
        else {
          if (*(char *)((long)__s + lVar16) != '\0') goto LAB_004d5931;
          pdVar4 = *(double **)((long)&psVar9->v1 + lVar21);
          pdVar5 = *(double **)((long)&psVar9->v2 + lVar21);
          dVar23 = pdVar5[1];
          dVar24 = *pdVar5 - delta.X;
          *pdVar4 = dVar24;
          pdVar4[1] = dVar23 - delta.Y;
          lVar18 = lVar16;
        }
        TVar25.Y = TVar25.Y;
        TVar25.X = dVar24;
        *(undefined1 *)(lVar18 + (long)__s) = 1;
      }
LAB_004d5931:
      uVar1 = psVar19[-1];
      uVar15 = (uint)uVar1;
      if ((uint)numlines <= (uint)uVar1) {
        puVar10 = (undefined4 *)__cxa_allocate_exception(TVar25.X,TVar25.Y,0xc);
        *puVar10 = 1;
LAB_004d5a45:
        puVar10[1] = (int)lVar12;
        puVar10[2] = uVar15;
        __cxa_throw(puVar10,&badseg::typeinfo,0);
      }
      plVar14 = lines + uVar1;
      *(line_t **)((long)&psVar9->linedef + lVar21) = plVar14;
      uVar20 = (ulong)*psVar19;
      lVar16 = (long)plVar14->sidedef[uVar20] - (long)sides;
      if ((uint)numsides <= (uint)(lVar16 / 0xd8)) {
        puVar10 = (undefined4 *)__cxa_allocate_exception(TVar25.X,TVar25.Y,0xc,&delta,lVar16 % 0xd8)
        ;
        uVar15 = (uint)(((long)plVar14->sidedef[uVar20] - (long)sides) / 0xd8);
        *puVar10 = 2;
        goto LAB_004d5a45;
      }
      *(side_t **)((long)&psVar9->sidedef + lVar21) = plVar14->sidedef[uVar20];
      *(sector_t **)((long)&psVar9->frontsector + lVar21) = plVar14->sidedef[uVar20]->sector;
      uVar15 = plVar14->flags;
      if (((uVar15 & 4) == 0) || (plVar14->sidedef[uVar20 ^ 1] == (side_t *)0x0)) {
        *(undefined8 *)((long)&psVar9->backsector + lVar21) = 0;
        plVar14->flags = uVar15 & 0xfffffffb;
      }
      else {
        *(sector_t **)((long)&psVar9->backsector + lVar21) = plVar14->sidedef[uVar20 ^ 1]->sector;
      }
      psVar19 = psVar19 + 8;
      lVar21 = lVar21 + 0x48;
    }
    operator_delete__(__s);
    operator_delete__(buffer);
  }
  return;
}

Assistant:

void P_LoadSegs (MapData * map)
{
	int  i;
	BYTE *data;
	BYTE *vertchanged = new BYTE[numvertexes];	// phares 10/4/98
	DWORD segangle;
	line_t* line;		// phares 10/4/98
	//int ptp_angle;		// phares 10/4/98
	//int delta_angle;	// phares 10/4/98
	int vnum1,vnum2;	// phares 10/4/98
	int lumplen = map->Size(ML_SEGS);

	memset (vertchanged,0,numvertexes); // phares 10/4/98

	numsegs = lumplen / sizeof(segtype);

	if (numsegs == 0)
	{
		Printf ("This map has no segs.\n");
		delete[] subsectors;
		delete[] nodes;
		delete[] vertchanged;
		ForceNodeBuild = true;
		return;
	}

	segs = new seg_t[numsegs];
	memset (segs, 0, numsegs*sizeof(seg_t));

	data = new BYTE[lumplen];
	map->Read(ML_SEGS, data);

	for (i = 0; i < numsubsectors; ++i)
	{
		subsectors[i].firstline = &segs[(size_t)subsectors[i].firstline];
	}

	// phares: 10/4/98: Vertchanged is an array that represents the vertices.
	// Mark those used by linedefs. A marked vertex is one that is not a
	// candidate for movement further down.

	line = lines;
	for (i = 0; i < numlines ; i++, line++)
	{
		vertchanged[line->v1 - vertexes] = vertchanged[line->v2 - vertexes] = 1;
	}

	try
	{
		for (i = 0; i < numsegs; i++)
		{
			seg_t *li = segs + i;
			segtype *ml = ((segtype *) data) + i;

			int side, linedef;
			line_t *ldef;

			vnum1 = ml->V1();
			vnum2 = ml->V2();

			if (vnum1 >= numvertexes || vnum2 >= numvertexes)
			{
				throw badseg(0, i, MAX(vnum1, vnum2));
			}

			li->v1 = &vertexes[vnum1];
			li->v2 = &vertexes[vnum2];

			segangle = (WORD)LittleShort(ml->angle);

			// phares 10/4/98: In the case of a lineseg that was created by splitting
			// another line, it appears that the line angle is inherited from the
			// father line. Due to roundoff, the new vertex may have been placed 'off
			// the line'. When you get close to such a line, and it is very short,
			// it's possible that the roundoff error causes 'firelines', the thin
			// lines that can draw from screen top to screen bottom occasionally. This
			// is due to all the angle calculations that are done based on the line
			// angle, the angles from the viewer to the vertices, and the viewer's
			// angle in the world. In the case of firelines, the rounded-off position
			// of one of the vertices determines one of these angles, and introduces
			// an error in the scaling factor for mapping textures and determining
			// where on the screen the ceiling and floor spans should be shown. For a
			// fireline, the engine thinks the ceiling bottom and floor top are at the
			// midpoint of the screen. So you get ceilings drawn all the way down to the
			// screen midpoint, and floors drawn all the way up. Thus 'firelines'. The
			// name comes from the original sighting, which involved a fire texture.
			//
			// To correct this, reset the vertex that was added so that it sits ON the
			// split line.
			//
			// To know which of the two vertices was added, its number is greater than
			// that of the last of the author-created vertices. If both vertices of the
			// line were added by splitting, pick the higher-numbered one. Once you've
			// changed a vertex, don't change it again if it shows up in another seg.
			//
			// To determine if there's an error in the first place, find the
			// angle of the line between the two seg vertices. If it's one degree or more
			// off, then move one vertex. This may seem insignificant, but one degree
			// errors _can_ cause firelines.

			DAngle ptp_angle = (li->v2->fPos() - li->v1->fPos()).Angle();
			DAngle seg_angle = AngleToFloat(segangle << 16);
			DAngle delta_angle = absangle(ptp_angle, seg_angle);

			if (delta_angle >= 1.)
			{
				double dis = (li->v2->fPos() - li->v1->fPos()).Length();
				DVector2 delta = seg_angle.ToVector(dis);
				if ((vnum2 > vnum1) && (vertchanged[vnum2] == 0))
				{
					li->v2->set(li->v1->fPos() + delta);
					vertchanged[vnum2] = 1; // this was changed
				}
				else if (vertchanged[vnum1] == 0)
				{
					li->v1->set(li->v2->fPos() - delta);
					vertchanged[vnum1] = 1; // this was changed
				}
			}

			linedef = LittleShort(ml->linedef);
			if ((unsigned)linedef >= (unsigned)numlines)
			{
				throw badseg(1, i, linedef);
			}
			ldef = &lines[linedef];
			li->linedef = ldef;
			side = LittleShort(ml->side);
			if ((unsigned)(ldef->sidedef[side] - sides) >= (unsigned)numsides)
			{
				throw badseg(2, i, int(ldef->sidedef[side] - sides));
			}
			li->sidedef = ldef->sidedef[side];
			li->frontsector = ldef->sidedef[side]->sector;

			// killough 5/3/98: ignore 2s flag if second sidedef missing:
			if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
			{
				li->backsector = ldef->sidedef[side^1]->sector;
			}
			else
			{
				li->backsector = 0;
				ldef->flags &= ~ML_TWOSIDED;
			}
		}
	}
	catch (const badseg &bad) // the preferred way is to catch by (const) reference.
	{
		switch (bad.badtype)
		{
		case 0:
			Printf ("Seg %d references a nonexistant vertex %d (max %d).\n", bad.badsegnum, bad.baddata, numvertexes);
			break;

		case 1:
			Printf ("Seg %d references a nonexistant linedef %d (max %d).\n", bad.badsegnum, bad.baddata, numlines);
			break;

		case 2:
			Printf ("The linedef for seg %d references a nonexistant sidedef %d (max %d).\n", bad.badsegnum, bad.baddata, numsides);
			break;
		}
		Printf ("The BSP will be rebuilt.\n");
		delete[] segs;
		delete[] subsectors;
		delete[] nodes;
		ForceNodeBuild = true;
	}

	delete[] vertchanged; // phares 10/4/98
	delete[] data;
}